

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DwaCompressor::LossyDctDecoderCsc::LossyDctDecoderCsc
          (LossyDctDecoderCsc *this,vector<char_*,_std::allocator<char_*>_> *rowPtrsR,
          vector<char_*,_std::allocator<char_*>_> *rowPtrsG,
          vector<char_*,_std::allocator<char_*>_> *rowPtrsB,char *packedAc,char *packedDc,
          unsigned_short *toLinear,int width,int height,PixelType typeR,PixelType typeG,
          PixelType typeB)

{
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  *this_00;
  vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_> *this_01;
  PixelType PVar1;
  PixelType PVar2;
  PixelType PVar3;
  PixelType *pPVar4;
  iterator iVar5;
  
  PVar3 = typeB;
  PVar2 = typeG;
  PVar1 = typeR;
  (this->super_LossyDctDecoderBase)._vptr_LossyDctDecoderBase =
       (_func_int **)&PTR__LossyDctDecoderBase_031e7d88;
  (this->super_LossyDctDecoderBase)._packedAcCount = 0;
  (this->super_LossyDctDecoderBase)._packedDcCount = 0;
  (this->super_LossyDctDecoderBase)._packedAc = packedAc;
  (this->super_LossyDctDecoderBase)._packedDc = packedDc;
  (this->super_LossyDctDecoderBase)._toLinear = toLinear;
  (this->super_LossyDctDecoderBase)._width = width;
  (this->super_LossyDctDecoderBase)._height = height;
  this_00 = &(this->super_LossyDctDecoderBase)._rowPtrs;
  (this->super_LossyDctDecoderBase)._rowPtrs.
  super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._rowPtrs.
  super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._rowPtrs.
  super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._type.
  super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._type.
  super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._type.
  super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._dctData.
  super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._dctData.
  super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._dctData.
  super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (toLinear == (unsigned_short *)0x0) {
    (this->super_LossyDctDecoderBase)._toLinear = (unsigned_short *)dwaCompressorNoOp;
  }
  (this->super_LossyDctDecoderBase)._isNativeXdr = (bool)GLOBAL_SYSTEM_LITTLE_ENDIAN;
  (this->super_LossyDctDecoderBase)._vptr_LossyDctDecoderBase =
       (_func_int **)&PTR__LossyDctDecoderBase_031e7ec0;
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::push_back(this_00,rowPtrsR);
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::push_back(this_00,rowPtrsG);
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::push_back(this_00,rowPtrsB);
  this_01 = &(this->super_LossyDctDecoderBase)._type;
  iVar5._M_current =
       (this->super_LossyDctDecoderBase)._type.
       super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pPVar4 = (this->super_LossyDctDecoderBase)._type.
           super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar5._M_current == pPVar4) {
    std::vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>>::
    _M_realloc_insert<Imf_2_5::PixelType_const&>
              ((vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>> *)this_01,iVar5,&typeR
              );
    iVar5._M_current =
         (this->super_LossyDctDecoderBase)._type.
         super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pPVar4 = (this->super_LossyDctDecoderBase)._type.
             super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar5._M_current = PVar1;
    iVar5._M_current = iVar5._M_current + 1;
    (this->super_LossyDctDecoderBase)._type.
    super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  if (iVar5._M_current == pPVar4) {
    std::vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>>::
    _M_realloc_insert<Imf_2_5::PixelType_const&>
              ((vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>> *)this_01,iVar5,&typeG
              );
    iVar5._M_current =
         (this->super_LossyDctDecoderBase)._type.
         super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pPVar4 = (this->super_LossyDctDecoderBase)._type.
             super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar5._M_current = PVar2;
    iVar5._M_current = iVar5._M_current + 1;
    (this->super_LossyDctDecoderBase)._type.
    super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  if (iVar5._M_current == pPVar4) {
    std::vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>>::
    _M_realloc_insert<Imf_2_5::PixelType_const&>
              ((vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>> *)this_01,iVar5,&typeB
              );
  }
  else {
    *iVar5._M_current = PVar3;
    (this->super_LossyDctDecoderBase)._type.
    super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  return;
}

Assistant:

LossyDctDecoderCsc
        (std::vector<char *> &rowPtrsR,
         std::vector<char *> &rowPtrsG,
         std::vector<char *> &rowPtrsB,
         char *packedAc,
         char *packedDc,
         const unsigned short *toLinear,
         int width,
         int height,
         PixelType typeR,
         PixelType typeG,
         PixelType typeB)
    :
        LossyDctDecoderBase(packedAc, packedDc, toLinear, width, height)
    {
        _rowPtrs.push_back(rowPtrsR);
        _rowPtrs.push_back(rowPtrsG);
        _rowPtrs.push_back(rowPtrsB);
        _type.push_back(typeR);
        _type.push_back(typeG);
        _type.push_back(typeB);
    }